

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseExtensions
          (Parser *this,DescriptorProto *message,LocationRecorder *extensions_location)

{
  bool bVar1;
  Type *descriptor;
  int iVar2;
  int iVar3;
  int start;
  int local_a4;
  LocationRecorder *local_a0;
  LocationRecorder start_location;
  LocationRecorder location;
  Token start_token;
  
  local_a0 = extensions_location;
  bVar1 = Consume(this,"extensions");
  if (bVar1) {
    do {
      LocationRecorder::LocationRecorder
                (&location,local_a0,
                 (message->extension_range_).super_RepeatedPtrFieldBase.current_size_);
      descriptor = internal::RepeatedPtrFieldBase::
                   Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                             (&(message->extension_range_).super_RepeatedPtrFieldBase);
      LocationRecorder::RecordLegacyLocation(&location,&descriptor->super_Message,NUMBER);
      start_token.text._M_dataplus._M_p = (pointer)&start_token.text.field_2;
      start_token.text._M_string_length = 0;
      start_token.text.field_2._M_local_buf[0] = '\0';
      LocationRecorder::LocationRecorder(&start_location,&location,1);
      io::Tokenizer::Token::operator=(&start_token,&this->input_->current_);
      bVar1 = ConsumeInteger(this,&start,"Expected field number range.");
      LocationRecorder::~LocationRecorder(&start_location);
      if (!bVar1) {
LAB_002187b7:
        std::__cxx11::string::~string((string *)&start_token.text);
        LocationRecorder::~LocationRecorder(&location);
        goto LAB_002187cb;
      }
      bVar1 = TryConsume(this,"to");
      if (bVar1) {
        LocationRecorder::LocationRecorder(&start_location,&location,2);
        bVar1 = TryConsume(this,"max");
        iVar3 = -2;
        if ((!bVar1) &&
           (bVar1 = ConsumeInteger(this,&local_a4,"Expected integer."), iVar3 = local_a4, !bVar1)) {
          LocationRecorder::~LocationRecorder(&start_location);
          goto LAB_002187b7;
        }
        LocationRecorder::~LocationRecorder(&start_location);
        iVar2 = start;
      }
      else {
        LocationRecorder::LocationRecorder(&start_location,&location,2);
        LocationRecorder::StartAt(&start_location,&start_token);
        LocationRecorder::EndAt(&start_location,&start_token);
        iVar2 = start;
        LocationRecorder::~LocationRecorder(&start_location);
        iVar3 = iVar2;
      }
      descriptor->start_ = iVar2;
      *(byte *)descriptor->_has_bits_ = (byte)descriptor->_has_bits_[0] | 3;
      descriptor->end_ = iVar3 + 1;
      std::__cxx11::string::~string((string *)&start_token.text);
      LocationRecorder::~LocationRecorder(&location);
      bVar1 = TryConsume(this,",");
    } while (bVar1);
    bVar1 = ConsumeEndOfDeclaration(this,";",local_a0);
  }
  else {
LAB_002187cb:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Parser::ParseExtensions(DescriptorProto* message,
                             const LocationRecorder& extensions_location) {
  // Parse the declaration.
  DO(Consume("extensions"));

  do {
    // Note that kExtensionRangeFieldNumber was already pushed by the parent.
    LocationRecorder location(extensions_location,
                              message->extension_range_size());

    DescriptorProto::ExtensionRange* range = message->add_extension_range();
    location.RecordLegacyLocation(
        range, DescriptorPool::ErrorCollector::NUMBER);

    int start, end;
    io::Tokenizer::Token start_token;

    {
      LocationRecorder start_location(
          location, DescriptorProto::ExtensionRange::kStartFieldNumber);
      start_token = input_->current();
      DO(ConsumeInteger(&start, "Expected field number range."));
    }

    if (TryConsume("to")) {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      if (TryConsume("max")) {
        // Set to the sentinel value - 1 since we increment the value below.
        // The actual value of the end of the range should be set with
        // AdjustExtensionRangesWithMaxEndNumber.
        end = kMaxExtensionRangeSentinel - 1;
      } else {
        DO(ConsumeInteger(&end, "Expected integer."));
      }
    } else {
      LocationRecorder end_location(
          location, DescriptorProto::ExtensionRange::kEndFieldNumber);
      end_location.StartAt(start_token);
      end_location.EndAt(start_token);
      end = start;
    }

    // Users like to specify inclusive ranges, but in code we like the end
    // number to be exclusive.
    ++end;

    range->set_start(start);
    range->set_end(end);
  } while (TryConsume(","));

  DO(ConsumeEndOfDeclaration(";", &extensions_location));
  return true;
}